

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O3

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Resize(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
         *this,int newSize)

{
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  hash_t hVar6;
  undefined4 *puVar7;
  HeapAllocator *this_00;
  EntryType **__s;
  uint emptyBucketCount;
  size_t sVar8;
  ulong uVar9;
  EntryType *pEVar10;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->disableResize == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
                       ,0x172,"(!this->disableResize)","!this->disableResize");
    if (!bVar3) goto LAB_0071f490;
    *puVar7 = 0;
  }
  local_58 = (undefined1  [8])&SimpleHashEntry<void*,Memory::Recycler::PinRecord>*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2792d81;
  data.filename._0_4_ = 0x173;
  data.plusSize = (long)newSize;
  this_00 = Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_58);
  sVar8 = 0xffffffffffffffff;
  if (-1 < newSize) {
    sVar8 = (long)newSize * 8;
  }
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_0071f490;
    *puVar7 = 0;
  }
  __s = (EntryType **)Memory::HeapAllocator::AllocT<false>(this_00,sVar8);
  memset(__s,0,sVar8);
  if (__s == (EntryType **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_0071f490:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  uVar5 = this->size;
  if (uVar5 == 0) {
    sVar8 = 0;
  }
  else {
    uVar9 = 0;
    do {
      pEVar10 = this->table[uVar9];
      if (this->table[uVar9] != (EntryType *)0x0) {
        do {
          hVar6 = PrimePolicy::ModPrime
                            ((hash_t)((ulong)pEVar10->key >> 4),newSize,this->modFunctionIndex);
          pSVar1 = pEVar10->next;
          pEVar10->next = __s[(int)hVar6];
          __s[(int)hVar6] = pEVar10;
          pEVar10 = pSVar1;
        } while (pSVar1 != (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0);
        uVar5 = this->size;
      }
      uVar9 = uVar9 + 1;
      sVar8 = (size_t)uVar5;
    } while (uVar9 < sVar8);
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
            (this->allocator,sVar8,this->table);
  this->size = newSize;
  this->table = __s;
  if (this->stats != (DictionaryStats *)0x0) {
    if (newSize == 0) {
      emptyBucketCount = 0;
    }
    else {
      uVar9 = 0;
      emptyBucketCount = 0;
      do {
        emptyBucketCount = emptyBucketCount + (__s[uVar9] == (EntryType *)0x0);
        uVar9 = uVar9 + 1;
      } while ((uint)newSize != uVar9);
    }
    DictionaryStats::Resize(this->stats,newSize,emptyBucketCount);
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
        Assert(!this->disableResize);
        EntryType** newTable = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, newSize);

        for (uint i=0; i < size; i++)
        {
            EntryType* current = table[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->key, newSize);
                EntryType* next = current->next; // Cache the next pointer
                current->next = newTable[targetBucket];
                newTable[targetBucket] = current;
                current = next;
            }
        }

        AllocatorDeleteArray(TAllocator, allocator, this->size, this->table);
        this->size = newSize;
        this->table = newTable;
#if PROFILE_DICTIONARY
        if (stats)
        {
            uint emptyBuckets  = 0 ;
            for (uint i=0; i < size; i++)
            {
                if(table[i] == nullptr)
                {
                    emptyBuckets++;
                }
            }
            stats->Resize(newSize, emptyBuckets);
        }
#endif

    }